

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O3

void __thiscall
SGParser::Generator::Grammar::Create
          (Grammar *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *symbolMap,
          vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
          *prodList)

{
  if ((this->ProductionCount != 0) ||
     ((this->StartSymbols).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->StartSymbols).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    Clear(this);
  }
  AddGrammarSymbols(this,symbolMap);
  AddProductions(this,prodList);
  return;
}

Assistant:

void Grammar::Create(const std::map<String, unsigned>& symbolMap,
                     std::vector<Production>& prodList) {
    // Clears the grammar if it is already valid
    if (ProductionCount || StartSymbols.size())
        Clear();
    // Adds the grammar data
    AddGrammarSymbols(symbolMap);
    AddProductions(prodList);
}